

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O2

int reverse_jmp_opcode(int opcode)

{
  int iVar1;
  
  if (opcode - 0x1cU < 6) {
    iVar1 = *(int *)(&DAT_00116284 + (ulong)(opcode - 0x1cU) * 4);
  }
  else {
    iVar1 = 0;
    lc_error("Cannot reverse comparison jmp opcode %i.");
  }
  return iVar1;
}

Assistant:

int reverse_jmp_opcode(int opcode)
{
	switch (opcode) {
	case SPO_JE:	return SPO_JNE;
	case SPO_JNE:	return SPO_JE;
	case SPO_JL:	return SPO_JGE;
	case SPO_JG:	return SPO_JLE;
	case SPO_JLE:	return SPO_JG;
	case SPO_JGE:	return SPO_JL;
	default:
	    lc_error("Cannot reverse comparison jmp opcode %i.", opcode);
	    return SPO_NULL;
	}
}